

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O3

void __thiscall
OpenMD::TrappeTorsionType::TrappeTorsionType
          (TrappeTorsionType *this,RealType c0,RealType c1,RealType c2,RealType c3,bool trans180)

{
  _Rb_tree_header *p_Var1;
  DoublePolynomial *this_00;
  mapped_type *pmVar2;
  undefined7 in_register_00000031;
  mapped_type mVar3;
  key_type local_54;
  double local_50;
  double local_48;
  double local_40;
  mapped_type local_38;
  undefined8 uStack_30;
  double local_28;
  
  p_Var1 = &(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialTorsionType).super_TorsionType._vptr_TorsionType =
       (_func_int **)&PTR__PolynomialTorsionType_00251860;
  this->c0_ = c0;
  this->c1_ = c1;
  this->c2_ = c2;
  this->c3_ = c3;
  uStack_30 = 0;
  local_38 = c3 * -3.0 + c1;
  if ((int)CONCAT71(in_register_00000031,trans180) == 0) {
    uStack_30 = 0x8000000000000000;
    local_38 = -local_38;
  }
  this_00 = &(this->super_PolynomialTorsionType).polynomial_;
  local_54 = 0;
  local_50 = c2;
  local_48 = c1;
  local_40 = c0;
  local_28 = c3;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = local_50 + local_50 + local_40 + local_48 + local_28;
  local_54 = 1;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = local_38;
  local_54 = 2;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  *pmVar2 = local_50 * -2.0;
  local_54 = 3;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this_00->polyPairMap_,&local_54);
  mVar3 = local_28 * 4.0;
  if (!trans180) {
    mVar3 = -mVar3;
  }
  *pmVar2 = mVar3;
  return;
}

Assistant:

TrappeTorsionType(RealType c0, RealType c1, RealType c2, RealType c3,
                      bool trans180) :
        PolynomialTorsionType(),
        c0_(c0), c1_(c1), c2_(c2), c3_(c3) {
      // convert Trappe Torsion Type to Polynomial Torsion type

      RealType b0 = c0 + c1 + 2.0 * c2 + c3;
      RealType b1 = c1 - 3.0 * c3;
      RealType b2 = -2.0 * c2;
      RealType b3 = 4.0 * c3;

      if (!trans180) {
        b1 = -b1;
        b3 = -b3;
      }

      setCoefficient(0, b0);
      setCoefficient(1, b1);
      setCoefficient(2, b2);
      setCoefficient(3, b3);
    }